

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

bool draco::parser::ParseString(DecoderBuffer *buffer,string *out_string)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  SkipWhitespace(buffer);
  bVar3 = 0;
  while( true ) {
    lVar2 = buffer->data_size_;
    lVar1 = buffer->pos_ + 1;
    if (lVar2 < lVar1) {
      bVar3 = 1;
      bVar5 = false;
    }
    else {
      iVar4 = isspace((uint)(byte)buffer->data_[buffer->pos_]);
      bVar5 = iVar4 != 0;
    }
    if (((bool)(bVar5 | bVar3)) || (lVar2 < lVar1)) break;
    buffer->pos_ = lVar1;
    std::__cxx11::string::push_back((char)out_string);
  }
  return (bool)(bVar5 | bVar3);
}

Assistant:

bool ParseString(DecoderBuffer *buffer, std::string *out_string) {
  out_string->clear();
  SkipWhitespace(buffer);
  bool end_reached = false;
  while (!PeekWhitespace(buffer, &end_reached) && !end_reached) {
    char c;
    if (!buffer->Decode(&c)) {
      return false;
    }
    *out_string += c;
  }
  return true;
}